

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2table.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *__s;
  int *piVar1;
  vector<float,_std::allocator<float>_> *pvVar2;
  pointer pvVar3;
  iterator iVar4;
  pointer pfVar5;
  pointer pvVar6;
  int iVar7;
  char *pcVar8;
  FILE *__stream;
  size_t sVar9;
  ulong uVar10;
  EVP_PKEY_CTX *ctx;
  long lVar11;
  int nconsumed;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  paths;
  char filepath [256];
  Option opt;
  string method;
  undefined1 local_798 [32];
  char *local_778;
  int *local_770;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_768;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 local_738;
  char *local_728;
  ulong local_720;
  char **local_718;
  ulong local_710;
  pointer local_708;
  iterator iStack_700;
  vector<float,_std::allocator<float>_> local_6f8 [10];
  QuantNet local_600;
  Option local_478;
  undefined1 local_438 [1032];
  
  if (argc < 5) {
LAB_00141d93:
    show_usage();
    return -1;
  }
  uVar10 = 1;
  do {
    if (*argv[uVar10] == '-') goto LAB_00141d93;
    uVar10 = uVar10 + 1;
  } while ((uint)argc != uVar10);
  local_778 = (char *)CONCAT44(local_778._4_4_,argc);
  pcVar8 = argv[1];
  ctx = (EVP_PKEY_CTX *)argv[2];
  __s = argv[3];
  local_728 = argv[4];
  local_718 = argv;
  ncnn::Option::Option(&local_478);
  local_478.num_threads = 1;
  local_478.use_fp16_packed = false;
  local_478.use_fp16_storage = false;
  local_478.use_fp16_arithmetic = false;
  QuantNet::QuantNet(&local_600);
  local_600.super_Net.opt.num_threads = local_478.num_threads;
  local_600.super_Net.opt.lightmode = local_478.lightmode;
  local_600.super_Net.opt._1_3_ = local_478._1_3_;
  local_600.super_Net.opt.use_fp16_packed = local_478.use_fp16_packed;
  local_600.super_Net.opt.use_fp16_storage = local_478.use_fp16_storage;
  local_600.super_Net.opt.use_bf16_storage = local_478.use_bf16_storage;
  local_600.super_Net.opt.use_fp16_arithmetic = local_478.use_fp16_arithmetic;
  local_600.super_Net.opt.use_int8_packed = local_478.use_int8_packed;
  local_600.super_Net.opt.use_int8_storage = local_478.use_int8_storage;
  local_600.super_Net.opt.use_int8_arithmetic = local_478.use_int8_arithmetic;
  local_600.super_Net.opt.use_packing_layout = local_478.use_packing_layout;
  local_600.super_Net.opt.flush_denormals = local_478.flush_denormals;
  local_600.super_Net.opt.use_local_pool_allocator = local_478.use_local_pool_allocator;
  local_600.super_Net.opt.use_reserved_1 = local_478.use_reserved_1;
  local_600.super_Net.opt.use_reserved_2 = local_478.use_reserved_2;
  local_600.super_Net.opt.use_reserved_3 = local_478.use_reserved_3;
  local_600.super_Net.opt.use_reserved_4 = local_478.use_reserved_4;
  local_600.super_Net.opt.use_reserved_5 = local_478.use_reserved_5;
  local_600.super_Net.opt.use_reserved_6 = local_478.use_reserved_6;
  local_600.super_Net.opt.use_reserved_7 = local_478.use_reserved_7;
  local_600.super_Net.opt.use_reserved_8 = local_478.use_reserved_8;
  local_600.super_Net.opt.use_reserved_9 = local_478.use_reserved_9;
  local_600.super_Net.opt.use_reserved_10 = local_478.use_reserved_10;
  local_600.super_Net.opt.use_reserved_11 = local_478.use_reserved_11;
  local_600.super_Net.opt.use_shader_pack8 = local_478.use_shader_pack8;
  local_600.super_Net.opt.use_subgroup_basic = local_478.use_subgroup_basic;
  local_600.super_Net.opt.use_subgroup_vote = local_478.use_subgroup_vote;
  local_600.super_Net.opt.use_subgroup_ballot = local_478.use_subgroup_ballot;
  local_600.super_Net.opt.use_subgroup_shuffle = local_478.use_subgroup_shuffle;
  local_600.super_Net.opt.use_image_storage = local_478.use_image_storage;
  local_600.super_Net.opt.use_tensor_storage = local_478.use_tensor_storage;
  local_600.super_Net.opt.use_weight_fp16_storage = local_478.use_weight_fp16_storage;
  local_600.super_Net.opt.workspace_allocator = local_478.workspace_allocator;
  local_600.super_Net.opt.openmp_blocktime = local_478.openmp_blocktime;
  local_600.super_Net.opt.use_winograd_convolution = local_478.use_winograd_convolution;
  local_600.super_Net.opt.use_sgemm_convolution = local_478.use_sgemm_convolution;
  local_600.super_Net.opt.use_int8_inference = local_478.use_int8_inference;
  local_600.super_Net.opt.use_vulkan_compute = local_478.use_vulkan_compute;
  local_600.super_Net.opt.blob_allocator = local_478.blob_allocator;
  ncnn::Net::load_param(&local_600.super_Net,pcVar8);
  ncnn::Net::load_model(&local_600.super_Net,(char *)ctx);
  QuantNet::init(&local_600,ctx);
  local_768.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_768.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_768.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar8 = strtok(__s,",");
  if (pcVar8 != (char *)0x0) {
    do {
      __stream = fopen(pcVar8,"rb");
      if (__stream == (FILE *)0x0) {
        fprintf(_stderr,"fopen %s failed\n",pcVar8);
        break;
      }
      local_748 = 0;
      uStack_740 = 0;
      local_738 = 0;
      iVar7 = feof(__stream);
      while ((iVar7 == 0 && (pcVar8 = fgets(local_438,0x400,__stream), pcVar8 != (char *)0x0))) {
        iVar7 = __isoc99_sscanf(local_438,"%255s",&local_708);
        if (iVar7 == 1) {
          local_798._0_8_ = (vector<float,_std::allocator<float>_> *)(local_798 + 0x10);
          sVar9 = strlen((char *)&local_708);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_798,&local_708,(long)&local_708 + sVar9);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_748
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_798
                    );
          if ((vector<float,_std::allocator<float>_> *)local_798._0_8_ !=
              (vector<float,_std::allocator<float>_> *)(local_798 + 0x10)) {
            operator_delete((void *)local_798._0_8_);
          }
        }
        iVar7 = feof(__stream);
      }
      fclose(__stream);
      std::
      vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::push_back(&local_768,(value_type *)&local_748);
      pcVar8 = strtok((char *)0x0,",");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_748);
    } while (pcVar8 != (char *)0x0);
  }
  local_438._16_8_ =
       local_600.listspaths.
       super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_438._8_8_ =
       local_600.listspaths.
       super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_438._0_8_ =
       local_600.listspaths.
       super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_600.listspaths.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_768.
       super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_600.listspaths.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_768.
       super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_600.listspaths.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_768.
       super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_768.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_768.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_768.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             *)local_438);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector(&local_768);
  local_438._0_8_ = local_438 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"kl","");
  if ((int)local_778 != 5) {
    local_720 = 6;
    if (6 < (int)local_778) {
      local_720 = (ulong)local_778 & 0xffffffff;
    }
    uVar10 = 5;
    do {
      piVar1 = (int *)local_718[uVar10];
      local_710 = uVar10;
      pcVar8 = strchr((char *)piVar1,0x3d);
      if (pcVar8 == (char *)0x0) {
        fprintf(_stderr,"unrecognized arg %s\n",piVar1);
      }
      else {
        *pcVar8 = '\0';
        local_778 = pcVar8 + 1;
        local_770 = piVar1;
        if (*piVar1 == 0x6e61656d) {
          parse_comma_float_array_list
                    ((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                      *)local_798,local_778);
          local_6f8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)local_600.means.
                        super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
          iStack_700._M_current =
               (int *)local_600.means.
                      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          local_708 = local_600.means.
                      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          local_600.means.
          super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_798._16_8_;
          local_600.means.
          super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)local_798._0_8_;
          local_600.means.
          super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_798._8_8_;
          local_798._0_8_ = (vector<float,_std::allocator<float>_> *)0x0;
          local_798._8_8_ = (pointer)0x0;
          local_798._16_8_ = (int *)0x0;
          std::
          vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
          ::~vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                     *)&local_708);
          std::
          vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
          ::~vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                     *)local_798);
        }
        if (*local_770 == 0x6d726f6e) {
          parse_comma_float_array_list
                    ((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                      *)local_798,local_778);
          local_6f8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)local_600.norms.
                        super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
          iStack_700._M_current =
               (int *)local_600.norms.
                      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          local_708 = local_600.norms.
                      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          local_600.norms.
          super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_798._16_8_;
          local_600.norms.
          super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)local_798._0_8_;
          local_600.norms.
          super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_798._8_8_;
          local_798._0_8_ = (vector<float,_std::allocator<float>_> *)0x0;
          local_798._8_8_ = (pointer)0x0;
          local_798._16_8_ = (int *)0x0;
          std::
          vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
          ::~vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                     *)&local_708);
          std::
          vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
          ::~vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                     *)local_798);
        }
        if ((char)local_770[1] == 'e' && *local_770 == 0x70616873) {
          local_798._0_8_ = (vector<float,_std::allocator<float>_> *)0x0;
          local_798._8_8_ = (pointer)0x0;
          local_798._16_8_ = (int *)0x0;
          pcVar8 = strtok(local_778,"[]");
          pvVar2 = (vector<float,_std::allocator<float>_> *)local_798._0_8_;
          pvVar6 = (pointer)local_798._8_8_;
          pvVar3 = (pointer)local_798._16_8_;
          while (pcVar8 != (char *)0x0) {
            local_768.
            super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)((ulong)local_768.
                                  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
            local_798._0_8_ = pvVar2;
            local_798._8_8_ = pvVar6;
            local_798._16_8_ = pvVar3;
            iVar7 = __isoc99_sscanf(pcVar8,"%d%n",&local_748,&local_768);
            if (iVar7 == 1) {
              lVar11 = (long)(int)local_768.
                                  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start;
              local_708 = (vector<float,_std::allocator<float>_> *)0x0;
              iStack_700._M_current = (int *)0x0;
              local_6f8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&local_708,(iterator)0x0,
                         (int *)&local_748);
              while( true ) {
                pcVar8 = pcVar8 + lVar11;
                iVar7 = __isoc99_sscanf(pcVar8,",%d%n",&local_748,&local_768);
                if (iVar7 != 1) break;
                lVar11 = (long)(int)local_768.
                                    super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
                if ((pointer)iStack_700._M_current ==
                    local_6f8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            ((vector<int,std::allocator<int>> *)&local_708,iStack_700,
                             (int *)&local_748);
                }
                else {
                  *iStack_700._M_current = (int)local_748;
                  iStack_700._M_current = iStack_700._M_current + 1;
                }
              }
              std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::push_back((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           *)local_798,(value_type *)&local_708);
              if (local_708 != (vector<float,_std::allocator<float>_> *)0x0) {
                operator_delete(local_708);
              }
            }
            pcVar8 = strtok((char *)0x0,"[]");
            pvVar2 = (vector<float,_std::allocator<float>_> *)local_798._0_8_;
            pvVar6 = (pointer)local_798._8_8_;
            pvVar3 = (pointer)local_798._16_8_;
          }
          local_798._0_8_ = (vector<float,_std::allocator<float>_> *)0x0;
          local_798._8_8_ = (pointer)0x0;
          local_798._16_8_ = (int *)0x0;
          local_708 = (pointer)local_600.shapes.
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
          iStack_700._M_current =
               (int *)local_600.shapes.
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          local_6f8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)local_600.shapes.
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_600.shapes.
          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)pvVar2;
          local_600.shapes.
          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)pvVar6;
          local_600.shapes.
          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pvVar3;
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     *)&local_708);
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     *)local_798);
        }
        pvVar6 = (pointer)local_600.type_to_pixels.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start;
        if ((char)local_770[1] == 'l' && *local_770 == 0x65786970) {
          local_708 = (pointer)0x0;
          iStack_700._M_current = (int *)0x0;
          local_6f8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          pcVar8 = strtok(local_778,",");
          pvVar6 = local_708;
          iVar4._M_current = iStack_700._M_current;
          pfVar5 = local_6f8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
          while (pcVar8 != (char *)0x0) {
            local_708 = pvVar6;
            iStack_700._M_current = iVar4._M_current;
            local_6f8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start = pfVar5;
            iVar7 = strcmp(pcVar8,"RAW");
            if (iVar7 == 0) {
              local_798._0_4_ = 0xffffff17;
              if ((pointer)iStack_700._M_current ==
                  local_6f8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          ((vector<int,_std::allocator<int>_> *)&local_708,iStack_700,
                           (int *)local_798);
              }
              else {
                *iStack_700._M_current = -0xe9;
                iStack_700._M_current = iStack_700._M_current + 1;
              }
            }
            iVar7 = strcmp(pcVar8,"RGB");
            if (iVar7 == 0) {
              local_798._0_4_ = 1;
              if ((pointer)iStack_700._M_current ==
                  local_6f8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          ((vector<int,_std::allocator<int>_> *)&local_708,iStack_700,
                           (int *)local_798);
              }
              else {
                *iStack_700._M_current = 1;
                iStack_700._M_current = iStack_700._M_current + 1;
              }
            }
            iVar7 = strcmp(pcVar8,"BGR");
            if (iVar7 == 0) {
              local_798._0_4_ = 2;
              if ((pointer)iStack_700._M_current ==
                  local_6f8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          ((vector<int,_std::allocator<int>_> *)&local_708,iStack_700,
                           (int *)local_798);
              }
              else {
                *iStack_700._M_current = 2;
                iStack_700._M_current = iStack_700._M_current + 1;
              }
            }
            iVar7 = strcmp(pcVar8,"GRAY");
            if (iVar7 == 0) {
              local_798._0_4_ = 3;
              if ((pointer)iStack_700._M_current ==
                  local_6f8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          ((vector<int,_std::allocator<int>_> *)&local_708,iStack_700,
                           (int *)local_798);
              }
              else {
                *iStack_700._M_current = 3;
                iStack_700._M_current = iStack_700._M_current + 1;
              }
            }
            iVar7 = strcmp(pcVar8,"RGBA");
            if (iVar7 == 0) {
              local_798._0_4_ = 4;
              if ((pointer)iStack_700._M_current ==
                  local_6f8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          ((vector<int,_std::allocator<int>_> *)&local_708,iStack_700,
                           (int *)local_798);
              }
              else {
                *iStack_700._M_current = 4;
                iStack_700._M_current = iStack_700._M_current + 1;
              }
            }
            iVar7 = strcmp(pcVar8,"BGRA");
            if (iVar7 == 0) {
              local_798._0_4_ = 5;
              if ((pointer)iStack_700._M_current ==
                  local_6f8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          ((vector<int,_std::allocator<int>_> *)&local_708,iStack_700,
                           (int *)local_798);
              }
              else {
                *iStack_700._M_current = 5;
                iStack_700._M_current = iStack_700._M_current + 1;
              }
            }
            pcVar8 = strtok((char *)0x0,",");
            pvVar6 = local_708;
            iVar4._M_current = iStack_700._M_current;
            pfVar5 = local_6f8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start;
          }
          local_708 = (vector<float,_std::allocator<float>_> *)0x0;
          iStack_700._M_current = (int *)0x0;
          local_6f8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_600.type_to_pixels.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar4._M_current;
          local_600.type_to_pixels.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)pfVar5;
          if (((pointer)local_600.type_to_pixels.super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) &&
             (pvVar3 = (pointer)local_600.type_to_pixels.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
             local_600.type_to_pixels.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start = (pointer)pvVar6, operator_delete(pvVar3),
             pvVar6 = (pointer)local_600.type_to_pixels.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start,
             local_708 != (vector<float,_std::allocator<float>_> *)0x0)) {
            operator_delete(local_708);
            pvVar6 = (pointer)local_600.type_to_pixels.super__Vector_base<int,_std::allocator<int>_>
                              ._M_impl.super__Vector_impl_data._M_start;
          }
        }
        local_600.type_to_pixels.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)pvVar6;
        piVar1 = local_770;
        if ((short)local_770[1] == 0x6461 && *local_770 == 0x65726874) {
          local_600.quantize_num_threads = atoi(local_778);
        }
        pcVar8 = local_778;
        if ((short)piVar1[1] == 0x646f && *piVar1 == 0x6874656d) {
          local_708 = local_6f8;
          sVar9 = strlen(local_778);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_708,pcVar8,pcVar8 + sVar9);
          std::__cxx11::string::operator=((string *)local_438,(string *)&local_708);
          if (local_708 != local_6f8) {
            operator_delete(local_708);
          }
        }
      }
      uVar10 = local_710 + 1;
    } while (uVar10 != local_720);
  }
  lVar11 = (long)local_600.input_blobs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_600.input_blobs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start >> 2;
  if (((long)local_600.listspaths.
             super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)local_600.listspaths.
             super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - lVar11 == 0) {
    if (((long)local_600.means.
               super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)local_600.means.
               super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - lVar11 != 0)
    {
      pcVar8 = "expect %d means, but got %d\n";
      goto LAB_001427c3;
    }
    if (((long)local_600.norms.
               super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)local_600.norms.
               super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - lVar11 != 0)
    {
      pcVar8 = "expect %d norms, but got %d\n";
      goto LAB_001427c3;
    }
    if (((long)local_600.shapes.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)local_600.shapes.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - lVar11 != 0)
    {
      pcVar8 = "expect %d shapes, but got %d\n";
      goto LAB_001427c3;
    }
    if ((long)local_600.type_to_pixels.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_600.type_to_pixels.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start >> 2 != lVar11) {
      pcVar8 = "expect %d pixels, but got %d\n";
      goto LAB_001427c3;
    }
    if (-1 < local_600.quantize_num_threads) {
      fwrite("mean = ",7,1,_stderr);
      print_float_array_list(&local_600.means);
      fputc(10,_stderr);
      fwrite("norm = ",7,1,_stderr);
      print_float_array_list(&local_600.norms);
      fputc(10,_stderr);
      fwrite("shape = ",8,1,_stderr);
      print_int_array_list(&local_600.shapes);
      fputc(10,_stderr);
      fwrite("pixel = ",8,1,_stderr);
      print_pixel_type_list(&local_600.type_to_pixels);
      fputc(10,_stderr);
      fprintf(_stderr,"thread = %d\n",(ulong)(uint)local_600.quantize_num_threads);
      fprintf(_stderr,"method = %s\n",local_438._0_8_);
      fwrite("---------------------------------------\n",0x28,1,_stderr);
      iVar7 = std::__cxx11::string::compare(local_438);
      if (iVar7 == 0) {
        QuantNet::quantize_KL(&local_600);
      }
      else {
        iVar7 = std::__cxx11::string::compare(local_438);
        if (iVar7 == 0) {
          QuantNet::quantize_ACIQ(&local_600);
        }
        else {
          iVar7 = std::__cxx11::string::compare(local_438);
          if (iVar7 != 0) {
            main_cold_1();
            goto LAB_001427ca;
          }
          QuantNet::quantize_EQ(&local_600);
        }
      }
      QuantNet::print_quant_info(&local_600);
      QuantNet::save_table(&local_600,local_728);
      iVar7 = 0;
      goto LAB_001427cf;
    }
    fprintf(_stderr,"malformed thread %d\n");
  }
  else {
    pcVar8 = "expect %d lists, but got %d\n";
LAB_001427c3:
    fprintf(_stderr,pcVar8);
  }
LAB_001427ca:
  iVar7 = -1;
LAB_001427cf:
  if ((pointer)local_438._0_8_ != (pointer)(local_438 + 0x10)) {
    operator_delete((void *)local_438._0_8_);
  }
  QuantNet::~QuantNet(&local_600);
  return iVar7;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc < 5)
    {
        show_usage();
        return -1;
    }

    for (int i = 1; i < argc; i++)
    {
        if (argv[i][0] == '-')
        {
            show_usage();
            return -1;
        }
    }

    const char* inparam = argv[1];
    const char* inbin = argv[2];
    char* lists = argv[3];
    const char* outtable = argv[4];

    ncnn::Option opt;
    opt.num_threads = 1;
    opt.use_fp16_packed = false;
    opt.use_fp16_storage = false;
    opt.use_fp16_arithmetic = false;

    QuantNet net;
    net.opt = opt;
    net.load_param(inparam);
    net.load_model(inbin);

    net.init();

    // load lists
    net.listspaths = parse_comma_path_list(lists);

    std::string method = "kl";

    for (int i = 5; i < argc; i++)
    {
        // key=value
        char* kv = argv[i];

        char* eqs = strchr(kv, '=');
        if (eqs == NULL)
        {
            fprintf(stderr, "unrecognized arg %s\n", kv);
            continue;
        }

        // split k v
        eqs[0] = '\0';
        const char* key = kv;
        char* value = eqs + 1;

        // load mean norm shape
        if (memcmp(key, "mean", 4) == 0)
            net.means = parse_comma_float_array_list(value);
        if (memcmp(key, "norm", 4) == 0)
            net.norms = parse_comma_float_array_list(value);
        if (memcmp(key, "shape", 5) == 0)
            net.shapes = parse_comma_int_array_list(value);
        if (memcmp(key, "pixel", 5) == 0)
            net.type_to_pixels = parse_comma_pixel_type_list(value);
        if (memcmp(key, "thread", 6) == 0)
            net.quantize_num_threads = atoi(value);
        if (memcmp(key, "method", 6) == 0)
            method = std::string(value);
    }

    // sanity check
    const size_t input_blob_count = net.input_blobs.size();
    if (net.listspaths.size() != input_blob_count)
    {
        fprintf(stderr, "expect %d lists, but got %d\n", (int)input_blob_count, (int)net.listspaths.size());
        return -1;
    }
    if (net.means.size() != input_blob_count)
    {
        fprintf(stderr, "expect %d means, but got %d\n", (int)input_blob_count, (int)net.means.size());
        return -1;
    }
    if (net.norms.size() != input_blob_count)
    {
        fprintf(stderr, "expect %d norms, but got %d\n", (int)input_blob_count, (int)net.norms.size());
        return -1;
    }
    if (net.shapes.size() != input_blob_count)
    {
        fprintf(stderr, "expect %d shapes, but got %d\n", (int)input_blob_count, (int)net.shapes.size());
        return -1;
    }
    if (net.type_to_pixels.size() != input_blob_count)
    {
        fprintf(stderr, "expect %d pixels, but got %d\n", (int)input_blob_count, (int)net.type_to_pixels.size());
        return -1;
    }
    if (net.quantize_num_threads < 0)
    {
        fprintf(stderr, "malformed thread %d\n", net.quantize_num_threads);
        return -1;
    }

    // print quantnet config
    {
        fprintf(stderr, "mean = ");
        print_float_array_list(net.means);
        fprintf(stderr, "\n");
        fprintf(stderr, "norm = ");
        print_float_array_list(net.norms);
        fprintf(stderr, "\n");
        fprintf(stderr, "shape = ");
        print_int_array_list(net.shapes);
        fprintf(stderr, "\n");
        fprintf(stderr, "pixel = ");
        print_pixel_type_list(net.type_to_pixels);
        fprintf(stderr, "\n");
        fprintf(stderr, "thread = %d\n", net.quantize_num_threads);
        fprintf(stderr, "method = %s\n", method.c_str());
        fprintf(stderr, "---------------------------------------\n");
    }

    if (method == "kl")
    {
        net.quantize_KL();
    }
    else if (method == "aciq")
    {
        net.quantize_ACIQ();
    }
    else if (method == "eq")
    {
        net.quantize_EQ();
    }
    else
    {
        fprintf(stderr, "not implemented yet !\n");
        fprintf(stderr, "unknown method %s, expect kl / aciq / eq\n", method.c_str());
        return -1;
    }

    net.print_quant_info();

    net.save_table(outtable);

    return 0;
}